

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qAverageColor.cpp
# Opt level: O1

uint32_t AverageColorRGBA8(uint32_t *Pixels,size_t Count)

{
  byte bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar9 [32];
  
  if (Count == 0) {
    uVar8 = 0;
    uVar7 = 0;
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    auVar12 = vpbroadcastq_avx512f();
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    uVar5 = 0;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar11._8_4_ = 0xff;
    auVar11._0_8_ = 0xff000000ff;
    auVar11._12_4_ = 0xff;
    auVar11._16_4_ = 0xff;
    auVar11._20_4_ = 0xff;
    auVar11._24_4_ = 0xff;
    auVar11._28_4_ = 0xff;
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar14 = vmovdqa64_avx512f(auVar21);
      auVar15 = vmovdqa64_avx512f(auVar20);
      auVar16 = vmovdqa64_avx512f(auVar19);
      auVar17 = vmovdqa64_avx512f(auVar18);
      auVar19 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar19,auVar13);
      uVar6 = vpcmpuq_avx512f(auVar19,auVar12,2);
      auVar9 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(Pixels + uVar5));
      bVar1 = (byte)uVar6;
      auVar10._4_4_ = (uint)((byte)(uVar6 >> 1) & 1) * auVar9._4_4_;
      auVar10._0_4_ = (uint)(bVar1 & 1) * auVar9._0_4_;
      auVar10._8_4_ = (uint)((byte)(uVar6 >> 2) & 1) * auVar9._8_4_;
      auVar10._12_4_ = (uint)((byte)(uVar6 >> 3) & 1) * auVar9._12_4_;
      auVar10._16_4_ = (uint)((byte)(uVar6 >> 4) & 1) * auVar9._16_4_;
      auVar10._20_4_ = (uint)((byte)(uVar6 >> 5) & 1) * auVar9._20_4_;
      auVar10._24_4_ = (uint)((byte)(uVar6 >> 6) & 1) * auVar9._24_4_;
      auVar10._28_4_ = (uint)(byte)(uVar6 >> 7) * auVar9._28_4_;
      auVar9 = vpsrld_avx2(auVar10,0x18);
      auVar19 = vpmovzxdq_avx512f(auVar9);
      auVar19 = vpaddq_avx512f(auVar16,auVar19);
      auVar9 = vpshufb_avx2(auVar10,_DAT_001176c0);
      auVar20 = vpmovzxdq_avx512f(auVar9);
      auVar20 = vpaddq_avx512f(auVar15,auVar20);
      auVar9 = vpshufb_avx2(auVar10,_DAT_001176e0);
      auVar21 = vpmovzxdq_avx512f(auVar9);
      auVar21 = vpaddq_avx512f(auVar14,auVar21);
      auVar9 = vpand_avx2(auVar10,auVar11);
      auVar18 = vpmovzxdq_avx512f(auVar9);
      auVar18 = vpaddq_avx512f(auVar17,auVar18);
      uVar5 = uVar5 + 8;
    } while ((Count + 7 & 0xfffffffffffffff8) != uVar5);
    auVar12 = vmovdqa64_avx512f(auVar21);
    auVar13._0_8_ = (ulong)(bVar1 & 1) * auVar12._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar14._0_8_;
    bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar13._8_8_ = (ulong)bVar2 * auVar12._8_8_ | (ulong)!bVar2 * auVar14._8_8_;
    bVar2 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar13._16_8_ = (ulong)bVar2 * auVar12._16_8_ | (ulong)!bVar2 * auVar14._16_8_;
    bVar2 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar13._24_8_ = (ulong)bVar2 * auVar12._24_8_ | (ulong)!bVar2 * auVar14._24_8_;
    bVar2 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar13._32_8_ = (ulong)bVar2 * auVar12._32_8_ | (ulong)!bVar2 * auVar14._32_8_;
    bVar2 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar13._40_8_ = (ulong)bVar2 * auVar12._40_8_ | (ulong)!bVar2 * auVar14._40_8_;
    bVar2 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar13._48_8_ = (ulong)bVar2 * auVar12._48_8_ | (ulong)!bVar2 * auVar14._48_8_;
    auVar13._56_8_ = (uVar6 >> 7) * auVar12._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar14._56_8_;
    auVar12 = vmovdqa64_avx512f(auVar20);
    auVar20._0_8_ = (ulong)(bVar1 & 1) * auVar12._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar15._0_8_;
    bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar20._8_8_ = (ulong)bVar2 * auVar12._8_8_ | (ulong)!bVar2 * auVar15._8_8_;
    bVar2 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar20._16_8_ = (ulong)bVar2 * auVar12._16_8_ | (ulong)!bVar2 * auVar15._16_8_;
    bVar2 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar20._24_8_ = (ulong)bVar2 * auVar12._24_8_ | (ulong)!bVar2 * auVar15._24_8_;
    bVar2 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar20._32_8_ = (ulong)bVar2 * auVar12._32_8_ | (ulong)!bVar2 * auVar15._32_8_;
    bVar2 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar20._40_8_ = (ulong)bVar2 * auVar12._40_8_ | (ulong)!bVar2 * auVar15._40_8_;
    bVar2 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar20._48_8_ = (ulong)bVar2 * auVar12._48_8_ | (ulong)!bVar2 * auVar15._48_8_;
    auVar20._56_8_ = (uVar6 >> 7) * auVar12._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar15._56_8_;
    auVar12 = vmovdqa64_avx512f(auVar19);
    auVar19._0_8_ = (ulong)(bVar1 & 1) * auVar12._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar16._0_8_;
    bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar19._8_8_ = (ulong)bVar2 * auVar12._8_8_ | (ulong)!bVar2 * auVar16._8_8_;
    bVar2 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar19._16_8_ = (ulong)bVar2 * auVar12._16_8_ | (ulong)!bVar2 * auVar16._16_8_;
    bVar2 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar19._24_8_ = (ulong)bVar2 * auVar12._24_8_ | (ulong)!bVar2 * auVar16._24_8_;
    bVar2 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar19._32_8_ = (ulong)bVar2 * auVar12._32_8_ | (ulong)!bVar2 * auVar16._32_8_;
    bVar2 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar19._40_8_ = (ulong)bVar2 * auVar12._40_8_ | (ulong)!bVar2 * auVar16._40_8_;
    bVar2 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar19._48_8_ = (ulong)bVar2 * auVar12._48_8_ | (ulong)!bVar2 * auVar16._48_8_;
    auVar19._56_8_ = (uVar6 >> 7) * auVar12._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar16._56_8_;
    auVar12 = vmovdqa64_avx512f(auVar18);
    auVar21._0_8_ = (ulong)(bVar1 & 1) * auVar12._0_8_ | (ulong)!(bool)(bVar1 & 1) * auVar17._0_8_;
    bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar21._8_8_ = (ulong)bVar2 * auVar12._8_8_ | (ulong)!bVar2 * auVar17._8_8_;
    bVar2 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar21._16_8_ = (ulong)bVar2 * auVar12._16_8_ | (ulong)!bVar2 * auVar17._16_8_;
    bVar2 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar21._24_8_ = (ulong)bVar2 * auVar12._24_8_ | (ulong)!bVar2 * auVar17._24_8_;
    bVar2 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar21._32_8_ = (ulong)bVar2 * auVar12._32_8_ | (ulong)!bVar2 * auVar17._32_8_;
    bVar2 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar21._40_8_ = (ulong)bVar2 * auVar12._40_8_ | (ulong)!bVar2 * auVar17._40_8_;
    bVar2 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar21._48_8_ = (ulong)bVar2 * auVar12._48_8_ | (ulong)!bVar2 * auVar17._48_8_;
    auVar21._56_8_ = (uVar6 >> 7) * auVar12._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar17._56_8_;
    auVar11 = vextracti64x4_avx512f(auVar21,1);
    auVar12 = vpaddq_avx512f(auVar21,ZEXT3264(auVar11));
    auVar3 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar5 = auVar3._0_8_;
    auVar11 = vextracti64x4_avx512f(auVar19,1);
    auVar12 = vpaddq_avx512f(auVar19,ZEXT3264(auVar11));
    auVar3 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar6 = auVar3._0_8_;
    auVar11 = vextracti64x4_avx512f(auVar20,1);
    auVar12 = vpaddq_avx512f(auVar20,ZEXT3264(auVar11));
    auVar3 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar7 = auVar3._0_8_;
    auVar11 = vextracti64x4_avx512f(auVar13,1);
    auVar12 = vpaddq_avx512f(auVar13,ZEXT3264(auVar11));
    auVar3 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpaddq_avx(auVar3,auVar4);
    uVar8 = auVar3._0_8_;
  }
  return (int)(uVar6 / Count) << 0x18 | ((uint)(uVar7 / Count) & 0xff) << 0x10 |
         ((uint)(uVar8 / Count) & 0xff) << 8 | (uint)(uVar5 / Count) & 0xff;
}

Assistant:

std::uint32_t AverageColorRGBA8(
	const std::uint32_t Pixels[],
	std::size_t Count
)
{
	std::uint64_t RedSum, GreenSum, BlueSum, AlphaSum;
	RedSum = GreenSum = BlueSum = AlphaSum = 0;
	for( std::size_t i = 0; i < Count; ++i )
	{
		const std::uint32_t& CurColor = Pixels[i];
		AlphaSum += static_cast<std::uint8_t>( CurColor >> 24 );
		BlueSum  += static_cast<std::uint8_t>( CurColor >> 16 );
		GreenSum += static_cast<std::uint8_t>( CurColor >>  8 );
		RedSum   += static_cast<std::uint8_t>( CurColor >>  0 );
	}
	RedSum   /= Count;
	GreenSum /= Count;
	BlueSum  /= Count;
	AlphaSum /= Count;

	return
		(static_cast<std::uint32_t>( (std::uint8_t)AlphaSum ) << 24 ) |
		(static_cast<std::uint32_t>( (std::uint8_t) BlueSum ) << 16 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)GreenSum ) <<  8 ) |
		(static_cast<std::uint32_t>( (std::uint8_t)  RedSum ) <<  0 );
}